

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseTopLevelStatement
          (Parser *this,FileDescriptorProto *file,LocationRecorder *root_location)

{
  int *piVar1;
  int iVar2;
  ErrorCollector *pEVar3;
  void **ppvVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  DescriptorProto *message;
  EnumDescriptorProto *enum_type;
  ServiceDescriptorProto *service;
  FileOptions *options;
  LocationRecorder location;
  LocationRecorder local_48;
  Tokenizer *local_38;
  
  bVar5 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
  bVar6 = true;
  if (!bVar5) {
    iVar7 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
    if (iVar7 == 0) {
      iVar7 = (file->message_type_).super_RepeatedPtrFieldBase.current_size_;
      LocationRecorder::Init(&local_48,root_location);
      LocationRecorder::AddPath(&local_48,4);
      LocationRecorder::AddPath(&local_48,iVar7);
      iVar7 = (file->message_type_).super_RepeatedPtrFieldBase.current_size_;
      iVar2 = (file->message_type_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar7 < iVar2) {
        ppvVar4 = (file->message_type_).super_RepeatedPtrFieldBase.elements_;
        (file->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar7 + 1;
        message = (DescriptorProto *)ppvVar4[iVar7];
      }
      else {
        iVar7 = (file->message_type_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar2 == iVar7) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(file->message_type_).super_RepeatedPtrFieldBase,iVar7 + 1);
        }
        piVar1 = &(file->message_type_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        message = internal::GenericTypeHandler<google::protobuf::DescriptorProto>::New();
        ppvVar4 = (file->message_type_).super_RepeatedPtrFieldBase.elements_;
        iVar7 = (file->message_type_).super_RepeatedPtrFieldBase.current_size_;
        (file->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar7 + 1;
        ppvVar4[iVar7] = message;
      }
      bVar6 = ParseMessageDefinition(this,message,&local_48);
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
      if (iVar7 == 0) {
        iVar7 = (file->enum_type_).super_RepeatedPtrFieldBase.current_size_;
        LocationRecorder::Init(&local_48,root_location);
        LocationRecorder::AddPath(&local_48,5);
        LocationRecorder::AddPath(&local_48,iVar7);
        iVar7 = (file->enum_type_).super_RepeatedPtrFieldBase.current_size_;
        iVar2 = (file->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
        if (iVar7 < iVar2) {
          ppvVar4 = (file->enum_type_).super_RepeatedPtrFieldBase.elements_;
          (file->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar7 + 1;
          enum_type = (EnumDescriptorProto *)ppvVar4[iVar7];
        }
        else {
          iVar7 = (file->enum_type_).super_RepeatedPtrFieldBase.total_size_;
          if (iVar2 == iVar7) {
            internal::RepeatedPtrFieldBase::Reserve
                      (&(file->enum_type_).super_RepeatedPtrFieldBase,iVar7 + 1);
          }
          piVar1 = &(file->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
          *piVar1 = *piVar1 + 1;
          enum_type = internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>::New();
          ppvVar4 = (file->enum_type_).super_RepeatedPtrFieldBase.elements_;
          iVar7 = (file->enum_type_).super_RepeatedPtrFieldBase.current_size_;
          (file->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar7 + 1;
          ppvVar4[iVar7] = enum_type;
        }
        bVar6 = ParseEnumDefinition(this,enum_type,&local_48);
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
        if (iVar7 == 0) {
          iVar7 = (file->service_).super_RepeatedPtrFieldBase.current_size_;
          LocationRecorder::Init(&local_48,root_location);
          LocationRecorder::AddPath(&local_48,6);
          LocationRecorder::AddPath(&local_48,iVar7);
          iVar7 = (file->service_).super_RepeatedPtrFieldBase.current_size_;
          iVar2 = (file->service_).super_RepeatedPtrFieldBase.allocated_size_;
          if (iVar7 < iVar2) {
            ppvVar4 = (file->service_).super_RepeatedPtrFieldBase.elements_;
            (file->service_).super_RepeatedPtrFieldBase.current_size_ = iVar7 + 1;
            service = (ServiceDescriptorProto *)ppvVar4[iVar7];
          }
          else {
            iVar7 = (file->service_).super_RepeatedPtrFieldBase.total_size_;
            if (iVar2 == iVar7) {
              internal::RepeatedPtrFieldBase::Reserve
                        (&(file->service_).super_RepeatedPtrFieldBase,iVar7 + 1);
            }
            piVar1 = &(file->service_).super_RepeatedPtrFieldBase.allocated_size_;
            *piVar1 = *piVar1 + 1;
            service = internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>::New();
            ppvVar4 = (file->service_).super_RepeatedPtrFieldBase.elements_;
            iVar7 = (file->service_).super_RepeatedPtrFieldBase.current_size_;
            (file->service_).super_RepeatedPtrFieldBase.current_size_ = iVar7 + 1;
            ppvVar4[iVar7] = service;
          }
          bVar6 = ParseServiceDefinition(this,service,&local_48);
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
          if (iVar7 == 0) {
            LocationRecorder::Init(&local_48,root_location);
            LocationRecorder::AddPath(&local_48,7);
            bVar6 = ParseExtend(this,&file->extension_,&file->message_type_,root_location,4,
                                &local_48);
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
            if (iVar7 == 0) {
              bVar5 = ParseImport(this,&file->dependency_,&file->public_dependency_,
                                  &file->weak_dependency_,root_location);
              return bVar5;
            }
            iVar7 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
            if (iVar7 == 0) {
              bVar5 = ParsePackage(this,file,root_location);
              return bVar5;
            }
            iVar7 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
            if (iVar7 != 0) {
              local_48.parser_ = (Parser *)&stack0xffffffffffffffc8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_48,"Expected top-level statement (e.g. \"message\").","");
              pEVar3 = this->error_collector_;
              if (pEVar3 != (ErrorCollector *)0x0) {
                (*pEVar3->_vptr_ErrorCollector[2])
                          (pEVar3,(ulong)(uint)(this->input_->current_).line,
                           (ulong)(uint)(this->input_->current_).column,&local_48);
              }
              this->had_errors_ = true;
              if (local_48.parser_ != (Parser *)&stack0xffffffffffffffc8) {
                operator_delete(local_48.parser_,(ulong)((long)&(local_38->current_).type + 1));
              }
              return false;
            }
            LocationRecorder::Init(&local_48,root_location);
            LocationRecorder::AddPath(&local_48,8);
            options = FileDescriptorProto::mutable_options(file);
            bVar6 = ParseOption(this,&options->super_Message,&local_48,OPTION_STATEMENT);
          }
        }
      }
    }
    LocationRecorder::~LocationRecorder(&local_48);
  }
  return bVar6;
}

Assistant:

bool Parser::ParseTopLevelStatement(FileDescriptorProto* file,
                                    const LocationRecorder& root_location) {
  if (TryConsumeEndOfDeclaration(";", NULL)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("message")) {
    LocationRecorder location(root_location,
      FileDescriptorProto::kMessageTypeFieldNumber, file->message_type_size());
    return ParseMessageDefinition(file->add_message_type(), location);
  } else if (LookingAt("enum")) {
    LocationRecorder location(root_location,
      FileDescriptorProto::kEnumTypeFieldNumber, file->enum_type_size());
    return ParseEnumDefinition(file->add_enum_type(), location);
  } else if (LookingAt("service")) {
    LocationRecorder location(root_location,
      FileDescriptorProto::kServiceFieldNumber, file->service_size());
    return ParseServiceDefinition(file->add_service(), location);
  } else if (LookingAt("extend")) {
    LocationRecorder location(root_location,
        FileDescriptorProto::kExtensionFieldNumber);
    return ParseExtend(file->mutable_extension(),
                       file->mutable_message_type(),
                       root_location,
                       FileDescriptorProto::kMessageTypeFieldNumber,
                       location);
  } else if (LookingAt("import")) {
    return ParseImport(file->mutable_dependency(),
                       file->mutable_public_dependency(),
                       file->mutable_weak_dependency(),
                       root_location);
  } else if (LookingAt("package")) {
    return ParsePackage(file, root_location);
  } else if (LookingAt("option")) {
    LocationRecorder location(root_location,
        FileDescriptorProto::kOptionsFieldNumber);
    return ParseOption(file->mutable_options(), location, OPTION_STATEMENT);
  } else {
    AddError("Expected top-level statement (e.g. \"message\").");
    return false;
  }
}